

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QList<QGraphicsItem_*> * __thiscall
QGraphicsView::items(QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsView *this,QPoint *pos)

{
  QPointer *this_00;
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  qreal *pqVar6;
  QTransform *pQVar7;
  QGraphicsScene *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QRectF local_f8;
  QTransform local_d8;
  QTransform xinv;
  
  bVar9 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  this_00 = (QPointer *)(lVar2 + 0x490);
  bVar3 = QPointer::operator_cast_to_bool(this_00);
  if (bVar3) {
    if (((*(byte *)(lVar2 + 0x300) & 0x10) == 0) && (iVar4 = QTransform::type(), 2 < iVar4)) {
      if ((*(long *)this_00 == 0) || (*(int *)(*(long *)this_00 + 4) == 0)) {
        pQVar8 = (QGraphicsScene *)0x0;
      }
      else {
        pQVar8 = *(QGraphicsScene **)(lVar2 + 0x498);
      }
      mapToScene((QPolygonF *)&local_d8,this,(pos->xp).m_i,(pos->yp).m_i,1,1);
      viewportTransform(&xinv,this);
      QGraphicsScene::items
                (__return_storage_ptr__,pQVar8,(QPolygonF *)&local_d8,IntersectsItemShape,
                 DescendingOrder,&xinv);
      QArrayDataPointer<QPointF>::~QArrayDataPointer((QArrayDataPointer<QPointF> *)&local_d8);
    }
    else {
      pqVar6 = (qreal *)&DAT_0067b698;
      pQVar7 = &xinv;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        pQVar7->m_matrix[0][0] = *pqVar6;
        pqVar6 = pqVar6 + (ulong)bVar9 * -2 + 1;
        pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      viewportTransform(&local_d8,this);
      pQVar8 = (QGraphicsScene *)0x0;
      QTransform::inverted((bool *)&xinv);
      if (*(long *)this_00 != 0) {
        if (*(int *)(*(long *)this_00 + 4) == 0) {
          pQVar8 = (QGraphicsScene *)0x0;
        }
        else {
          pQVar8 = *(QGraphicsScene **)(lVar2 + 0x498);
        }
      }
      QTransform::mapRect((QRectF *)&local_f8);
      viewportTransform(&local_d8,this);
      QGraphicsScene::items
                (__return_storage_ptr__,pQVar8,&local_f8,IntersectsItemShape,DescendingOrder,
                 &local_d8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsView::items(const QPoint &pos) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QList<QGraphicsItem *>();
    // ### Unify these two, and use the items(QPointF) version in
    // QGraphicsScene instead. The scene items function could use the viewport
    // transform to map the point to a rect/polygon.
    if ((d->identityMatrix || d->matrix.type() <= QTransform::TxScale)) {
        // Use the rect version
        QTransform xinv = viewportTransform().inverted();
        return d->scene->items(xinv.mapRect(QRectF(pos.x(), pos.y(), 1, 1)),
                               Qt::IntersectsItemShape,
                               Qt::DescendingOrder,
                               viewportTransform());
    }
    // Use the polygon version
    return d->scene->items(mapToScene(pos.x(), pos.y(), 1, 1),
                           Qt::IntersectsItemShape,
                           Qt::DescendingOrder,
                           viewportTransform());
}